

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf.cpp
# Opt level: O0

bool __thiscall CGameControllerCTF::OnEntity(CGameControllerCTF *this,int Index,vec2 Pos)

{
  long lVar1;
  vec2 StandPos;
  bool bVar2;
  void *pvVar3;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 in_ESI;
  IGameController *in_RDI;
  long in_FS_OFFSET;
  vec2 in_XMM0_Qa;
  CFlag *F;
  int Team;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  CGameWorld *in_stack_ffffffffffffffb0;
  CFlag *in_stack_ffffffffffffffb8;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar4;
  bool local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IGameController::OnEntity(in_RDI,(int)in_ESI,in_XMM0_Qa);
  if (bVar2) {
    local_21 = true;
  }
  else {
    aVar4.x = -NAN;
    if (in_ESI == (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x4) {
      aVar4.x = 0.0;
    }
    if (in_ESI == (anon_union_4_2_947302a4_for_vector2_base<float>_3)0x5) {
      aVar4.x = 1.4013e-45;
    }
    if ((aVar4 == (anon_union_4_2_94730284_for_vector2_base<float>_1)0xffffffff) ||
       (*(long *)(in_RDI[1].m_aTeamSize + (long)(int)aVar4 * 2 + -8) != 0)) {
      local_21 = false;
    }
    else {
      pvVar3 = CEntity::operator_new(CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      IGameController::GameServer(in_RDI);
      StandPos.field_1 = in_ESI;
      StandPos.field_0 = aVar4;
      CFlag::CFlag(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(int)((ulong)in_RDI >> 0x20),
                   StandPos);
      *(void **)(in_RDI[1].m_aTeamSize + (long)(int)aVar4 * 2 + -8) = pvVar3;
      local_21 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool CGameControllerCTF::OnEntity(int Index, vec2 Pos)
{
	if(IGameController::OnEntity(Index, Pos))
		return true;

	int Team = -1;
	if(Index == ENTITY_FLAGSTAND_RED) Team = TEAM_RED;
	if(Index == ENTITY_FLAGSTAND_BLUE) Team = TEAM_BLUE;
	if(Team == -1 || m_apFlags[Team])
		return false;

	CFlag *F = new CFlag(&GameServer()->m_World, Team, Pos);
	m_apFlags[Team] = F;
	return true;
}